

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::_::(anonymous_namespace)::RpcConnectionState::Export>::dispose
          (ArrayBuilder<capnp::_::(anonymous_namespace)::RpcConnectionState::Export> *this)

{
  Export *firstElement;
  RemoveConst<capnp::_::(anonymous_namespace)::RpcConnectionState::Export> *pRVar1;
  Export *pEVar2;
  Export *endCopy;
  Export *posCopy;
  Export *ptrCopy;
  ArrayBuilder<capnp::_::(anonymous_namespace)::RpcConnectionState::Export> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pEVar2 = this->endPtr;
  if (firstElement != (Export *)0x0) {
    this->ptr = (Export *)0x0;
    this->pos = (RemoveConst<capnp::_::(anonymous_namespace)::RpcConnectionState::Export> *)0x0;
    this->endPtr = (Export *)0x0;
    ArrayDisposer::dispose<capnp::_::(anonymous_namespace)::RpcConnectionState::Export>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0x28,
               ((long)pEVar2 - (long)firstElement) / 0x28);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }